

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Liby::Socket::Socket(Socket *this,Endpoint *ep,bool isUdp_)

{
  bool isUdp__local;
  Endpoint *ep_local;
  Socket *this_local;
  
  this->isUdp_ = isUdp_;
  this->fd_ = -1;
  std::shared_ptr<Liby::FileDescriptor>::shared_ptr(&this->fp_);
  this->ep_ = *ep;
  createSocket(this);
  return;
}

Assistant:

Socket::Socket(const Endpoint &ep, bool isUdp_) : isUdp_(isUdp_), ep_(ep) {
    createSocket();
}